

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall ast::IfStmt::~IfStmt(IfStmt *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__IfStmt_00179728;
  if (this->condition != (Expr *)0x0) {
    (*(this->condition->super_Node)._vptr_Node[1])();
  }
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  if (this->alternative != (BlockStmt *)0x0) {
    (*(this->alternative->super_Stmt).super_Node._vptr_Node[1])();
  }
  (this->tok)._vptr_Token = (_func_int **)&PTR__Token_001788e0;
  pcVar1 = (this->tok).Literal._M_dataplus._M_p;
  paVar2 = &(this->tok).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~IfStmt(){
        delete condition;
        delete body;
        delete alternative;
    }